

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDeep.c
# Opt level: O1

Gia_Man_t * Gia_ManDeepSynOne(int nNoImpr,int TimeOut,int nAnds,int Seed,int fUseTwo,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Abc_Frame_t *pAVar3;
  Gia_Man_t *pGVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  timespec *format;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  timespec ts_2;
  timespec ts;
  Gia_Man_t *local_458;
  long local_450;
  uint local_43c;
  timespec local_438;
  long local_428;
  int local_420;
  int local_41c;
  timespec local_418 [62];
  
  local_420 = fVerbose;
  local_41c = fUseTwo;
  if (TimeOut == 0) {
    local_428 = 0;
  }
  else {
    iVar1 = clock_gettime(3,local_418);
    if (iVar1 < 0) {
      local_428 = -1;
    }
    else {
      local_428 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
    }
    local_428 = (long)TimeOut * 1000000 + local_428;
  }
  iVar1 = clock_gettime(3,local_418);
  if (iVar1 < 0) {
    local_450 = -1;
  }
  else {
    local_450 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  pAVar3 = Abc_FrameGetGlobalFrame();
  pGVar4 = Abc_FrameReadGia(pAVar3);
  local_458 = Gia_ManDup(pGVar4);
  Abc_Random(1);
  if (-10 < Seed) {
    iVar1 = Seed + 9;
    if (Seed + 9 < 1) {
      iVar1 = 0;
    }
    iVar1 = iVar1 + 1;
    do {
      Abc_Random(0);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  local_43c = 0xffffffff;
  uVar11 = 0;
  do {
    uVar2 = Abc_Random(0);
    uVar10 = (uint)uVar11;
    if (local_41c == 0) {
      uVar5 = (uVar10 & 3) + 3;
    }
    else {
      uVar5 = (int)(uVar11 / 5) * -5 + 2 + uVar10;
    }
    pcVar9 = "; &put; compress2rs; &get";
    if ((uVar2 & 2) == 0) {
      pcVar9 = "; &dc2";
    }
    pcVar6 = " -f";
    if ((uVar2 & 1) == 0) {
      pcVar6 = "";
    }
    pcVar8 = "; &fx";
    if ((uVar2 & 4) == 0) {
      pcVar8 = "";
    }
    sprintf((char *)local_418,"&dch%s; &if -a -K %d; &mfs -e -W 20 -L 20%s%s",pcVar6,(ulong)uVar5,
            pcVar8,pcVar9);
    pAVar3 = Abc_FrameGetGlobalFrame();
    format = local_418;
    iVar1 = Cmd_CommandExecute(pAVar3,(char *)local_418);
    if (iVar1 == 0) {
      pAVar3 = Abc_FrameGetGlobalFrame();
      pGVar4 = Abc_FrameReadGia(pAVar3);
      iVar1 = (local_458->vCis->nSize - local_458->nObjs) + local_458->vCos->nSize;
      iVar12 = (pGVar4->vCis->nSize - pGVar4->nObjs) + pGVar4->vCos->nSize;
      if (iVar1 < iVar12) {
        Gia_ManStop(local_458);
        local_458 = Gia_ManDup(pGVar4);
        local_43c = uVar10;
      }
      if ((local_420 != 0) && (iVar1 < iVar12)) {
        printf("Iter %6d : ",uVar11);
        iVar1 = clock_gettime(3,&local_438);
        if (iVar1 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_438.tv_nsec / 1000 + local_438.tv_sec * 1000000;
        }
        printf("Time %8.2f sec : ",(double)((float)(lVar7 - local_450) / 1e+06));
        printf("And = %6d  ",
               (ulong)(uint)(~(local_458->vCos->nSize + local_458->vCis->nSize) + local_458->nObjs))
        ;
        uVar2 = Gia_ManLevelNum(local_458);
        printf("Lev = %3d  ",(ulong)uVar2);
        printf("<== best : ");
        printf("%s",local_418);
        putchar(10);
      }
      if (local_428 == 0) {
LAB_0072447f:
        iVar1 = 0;
        if ((int)(uVar10 - local_43c) <= nNoImpr) goto LAB_00724503;
        iVar1 = clock_gettime(3,&local_438);
        if (iVar1 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_438.tv_nsec / 1000 + local_438.tv_sec * 1000000;
        }
        printf("Completed %d iterations without improvement in %.2f seconds.\n",
               (double)((float)(lVar7 - local_450) / 1e+06),(ulong)(uint)nNoImpr);
      }
      else {
        iVar1 = clock_gettime(3,&local_438);
        if (iVar1 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_438.tv_nsec / 1000 + local_438.tv_sec * 1000000;
        }
        if (lVar7 <= local_428) goto LAB_0072447f;
        printf("Runtime limit (%d sec) is reached after %d iterations.\n",(ulong)(uint)TimeOut,
               uVar11);
      }
      iVar1 = 5;
    }
    else {
      Abc_Print((int)pAVar3,(char *)format,local_418);
      iVar1 = 1;
    }
LAB_00724503:
    if (iVar1 != 0) {
      if (iVar1 != 5) {
        return (Gia_Man_t *)0x0;
      }
      goto LAB_00724524;
    }
    uVar11 = (ulong)(uVar10 + 1);
    if (uVar10 + 1 == 100000) {
      uVar10 = 100000;
LAB_00724524:
      if (uVar10 == 100000) {
        iVar1 = clock_gettime(3,local_418);
        if (iVar1 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
        }
        printf("Iteration limit (%d iters) is reached after %.2f seconds.\n",
               (double)((float)(lVar7 - local_450) / 1e+06),100000);
      }
      else if (-2 < nAnds && nAnds != 0) {
        iVar1 = clock_gettime(3,local_418);
        if (iVar1 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
        }
        printf("Quality goal (%d nodes <= %d nodes) is achieved after %d iterations and %.2f seconds.\n"
               ,(double)((float)(lVar7 - local_450) / 1e+06),0xffffffff,(ulong)(uint)nAnds,
               (ulong)uVar10);
      }
      return local_458;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDeepSynOne( int nNoImpr, int TimeOut, int nAnds, int Seed, int fUseTwo, int fVerbose )
{
    abctime nTimeToStop = TimeOut ? Abc_Clock() + TimeOut * CLOCKS_PER_SEC : 0;
    abctime clkStart    = Abc_Clock();
    int s, i, IterMax   = 100000, nAndsMin = -1, iIterLast = -1;
    Gia_Man_t * pTemp   = Abc_FrameReadGia(Abc_FrameGetGlobalFrame());
    Gia_Man_t * pNew    = Gia_ManDup( pTemp );
    Abc_Random(1);
    for ( s = 0; s < 10+Seed; s++ )
        Abc_Random(0);
    for ( i = 0; i < IterMax; i++ )
    {
        unsigned Rand = Abc_Random(0);
        int fDch = Rand & 1;
        //int fCom = (Rand >> 1) & 3;
        int fCom = (Rand >> 1) & 1;
        int fFx  = (Rand >> 2) & 1;
        int KLut = fUseTwo ? 2 + (i % 5) : 3 + (i % 4);
        int fChange = 0;
        char Command[1000];
        char * pComp = NULL;
        if ( fCom == 3 )
            pComp = "; &put; compress2rs; compress2rs; compress2rs; &get";
        else if ( fCom == 2 )
            pComp = "; &put; compress2rs; compress2rs; &get";
        else if ( fCom == 1 )
            pComp = "; &put; compress2rs; &get";
        else if ( fCom == 0 )
            pComp = "; &dc2";
        sprintf( Command, "&dch%s; &if -a -K %d; &mfs -e -W 20 -L 20%s%s",
            fDch ? " -f" : "", KLut, fFx ? "; &fx" : "", pComp );
        if ( Cmd_CommandExecute(Abc_FrameGetGlobalFrame(), Command) )
        {
            Abc_Print( 1, "Something did not work out with the command \"%s\".\n", Command );
            return NULL;
        }
        pTemp = Abc_FrameReadGia(Abc_FrameGetGlobalFrame());
        if ( Gia_ManAndNum(pNew) > Gia_ManAndNum(pTemp) )
        {
            Gia_ManStop( pNew );
            pNew = Gia_ManDup( pTemp );
            fChange = 1;
            iIterLast = i;
        }
        else if ( Gia_ManAndNum(pNew) + Gia_ManAndNum(pNew)/10 < Gia_ManAndNum(pTemp) ) 
        {
            //printf( "Updating\n" );
            //Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), Gia_ManDup(pNew) );
        }
        if ( fChange && fVerbose )
        {
            printf( "Iter %6d : ", i );
            printf( "Time %8.2f sec : ", (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
            printf( "And = %6d  ", Gia_ManAndNum(pNew) );
            printf( "Lev = %3d  ", Gia_ManLevelNum(pNew) );
            if ( fChange ) 
                printf( "<== best : " );
            else if ( fVerbose )
                printf( "           " );
            printf( "%s", Command );
            printf( "\n" );
        }
        if ( nTimeToStop && Abc_Clock() > nTimeToStop )
        {
            printf( "Runtime limit (%d sec) is reached after %d iterations.\n", TimeOut, i );
            break;
        }
        if ( i - iIterLast > nNoImpr )
        {
            printf( "Completed %d iterations without improvement in %.2f seconds.\n", 
                nNoImpr, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
            break;
        }
    }
    if ( i == IterMax )
        printf( "Iteration limit (%d iters) is reached after %.2f seconds.\n", IterMax, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
    else if ( nAnds && nAndsMin <= nAnds )
        printf( "Quality goal (%d nodes <= %d nodes) is achieved after %d iterations and %.2f seconds.\n", 
            nAndsMin, nAnds, i, (float)1.0*(Abc_Clock() - clkStart)/CLOCKS_PER_SEC );
    return pNew;
}